

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<double,_2,_0>::calcRootLogLikelihoods
          (BeagleCPU4StateImpl<double,_2,_0> *this,int bufferIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  int iVar4;
  undefined4 in_ECX;
  int in_EDX;
  int in_ESI;
  double *in_RDI;
  undefined4 in_R8D;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  BeagleCPU4StateImpl<double,_2,_0> *unaff_retaddr;
  int k_1;
  double wtl;
  int l;
  int k;
  double wt0;
  int v;
  int u;
  double *wt;
  double *rootPartials;
  int local_54;
  int local_48;
  int local_44;
  int local_38;
  int local_34;
  
  lVar2 = *(long *)((long)in_RDI[0x16] + (long)in_ESI * 8);
  pdVar3 = *(double **)((long)in_RDI[0x14] + (long)in_EDX * 8);
  local_38 = 0;
  dVar1 = *pdVar3;
  for (local_44 = 0; local_44 < *(int *)((long)in_RDI + 0x14); local_44 = local_44 + 1) {
    *(double *)((long)in_RDI[0x1c] + (long)local_38 * 8) =
         *(double *)(lVar2 + (long)local_38 * 8) * dVar1;
    *(double *)((long)in_RDI[0x1c] + (long)(local_38 + 1) * 8) =
         *(double *)(lVar2 + (long)(local_38 + 1) * 8) * dVar1;
    *(double *)((long)in_RDI[0x1c] + (long)(local_38 + 2) * 8) =
         *(double *)(lVar2 + (long)(local_38 + 2) * 8) * dVar1;
    *(double *)((long)in_RDI[0x1c] + (long)(local_38 + 3) * 8) =
         *(double *)(lVar2 + (long)(local_38 + 3) * 8) * dVar1;
    local_38 = local_38 + 4;
  }
  for (local_48 = 1; local_48 < *(int *)((long)in_RDI + 0x34); local_48 = local_48 + 1) {
    local_34 = 0;
    dVar1 = pdVar3[local_48];
    for (local_54 = 0; local_54 < *(int *)((long)in_RDI + 0x14); local_54 = local_54 + 1) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(lVar2 + (long)local_38 * 8);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = dVar1;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = *(ulong *)((long)in_RDI[0x1c] + (long)local_34 * 8);
      auVar5 = vfmadd213sd_fma(auVar5,auVar9,auVar13);
      *(long *)((long)in_RDI[0x1c] + (long)local_34 * 8) = auVar5._0_8_;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = *(ulong *)(lVar2 + (long)(local_38 + 1) * 8);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = dVar1;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)((long)in_RDI[0x1c] + (long)(local_34 + 1) * 8);
      auVar5 = vfmadd213sd_fma(auVar6,auVar10,auVar14);
      *(long *)((long)in_RDI[0x1c] + (long)(local_34 + 1) * 8) = auVar5._0_8_;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(ulong *)(lVar2 + (long)(local_38 + 2) * 8);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = dVar1;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)((long)in_RDI[0x1c] + (long)(local_34 + 2) * 8);
      auVar5 = vfmadd213sd_fma(auVar7,auVar11,auVar15);
      *(long *)((long)in_RDI[0x1c] + (long)(local_34 + 2) * 8) = auVar5._0_8_;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *(ulong *)(lVar2 + (long)(local_38 + 3) * 8);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar1;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *(ulong *)((long)in_RDI[0x1c] + (long)(local_34 + 3) * 8);
      auVar5 = vfmadd213sd_fma(auVar8,auVar12,auVar16);
      *(long *)((long)in_RDI[0x1c] + (long)(local_34 + 3) * 8) = auVar5._0_8_;
      local_34 = local_34 + 4;
      local_38 = local_38 + 4;
    }
    local_38 = *(int *)((long)in_RDI + 0x1c) * 4 + local_38;
  }
  iVar4 = integrateOutStatesAndScale
                    (unaff_retaddr,in_RDI,in_ESI,in_EDX,(double *)CONCAT44(in_ECX,in_R8D));
  return iVar4;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoods(const int bufferIndex,
                                                           const int categoryWeightsIndex,
                                                           const int stateFrequenciesIndex,
                                                const int scalingFactorsIndex,
                                                double* outSumLogLikelihood) {

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    assert(rootPartials);
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];

    int u = 0;
    int v = 0;
    const REALTYPE wt0 = wt[0];
    for (int k = 0; k < kPatternCount; k++) {
        integrationTmp[v    ] = rootPartials[v    ] * wt0;
        integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
        integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
        integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
        v += 4;
    }
    for (int l = 1; l < kCategoryCount; l++) {
        u = 0;
        const REALTYPE wtl = wt[l];
        for (int k = 0; k < kPatternCount; k++) {
            integrationTmp[u    ] += rootPartials[v    ] * wtl;
            integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
            integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
            integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

            u += 4;
            v += 4;
        }
		v += 4 * kExtraPatterns;
    }

    return integrateOutStatesAndScale(integrationTmp, stateFrequenciesIndex, scalingFactorsIndex, outSumLogLikelihood);
}